

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftFvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pnVar4;
  pointer pnVar5;
  bool bVar6;
  Real RVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  cpp_dec_float<100U,_int,_void> *pcVar17;
  uint *puVar18;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar19;
  ulong uVar20;
  long lVar21;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_328;
  cpp_dec_float<100U,_int,_void> local_2d8;
  double local_280;
  double local_278;
  Random *local_270;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_d8,this);
  local_328.fpclass = cpp_dec_float_finite;
  local_328.prec_elem = 0x10;
  local_328.data._M_elems[0] = 0;
  local_328.data._M_elems[1] = 0;
  local_328.data._M_elems[2] = 0;
  local_328.data._M_elems[3] = 0;
  local_328.data._M_elems[4] = 0;
  local_328.data._M_elems[5] = 0;
  local_328.data._M_elems[6] = 0;
  local_328.data._M_elems[7] = 0;
  local_328.data._M_elems[8] = 0;
  local_328.data._M_elems[9] = 0;
  local_328.data._M_elems[10] = 0;
  local_328.data._M_elems[0xb] = 0;
  local_328.data._M_elems[0xc] = 0;
  local_328.data._M_elems[0xd] = 0;
  local_328.data._M_elems._56_5_ = 0;
  local_328.data._M_elems[0xf]._1_3_ = 0;
  local_328.exp = 0;
  local_328.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_328,10.0);
  local_88.data._M_elems[0] = local_d8.data._M_elems[0];
  local_88.data._M_elems[1] = local_d8.data._M_elems[1];
  local_88.data._M_elems[2] = local_d8.data._M_elems[2];
  local_88.data._M_elems[3] = local_d8.data._M_elems[3];
  local_88.data._M_elems[4] = local_d8.data._M_elems[4];
  local_88.data._M_elems[5] = local_d8.data._M_elems[5];
  local_88.data._M_elems[6] = local_d8.data._M_elems[6];
  local_88.data._M_elems[7] = local_d8.data._M_elems[7];
  local_88.data._M_elems[8] = local_d8.data._M_elems[8];
  local_88.data._M_elems[9] = local_d8.data._M_elems[9];
  local_88.data._M_elems[10] = local_d8.data._M_elems[10];
  local_88.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
  local_88.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
  local_88.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
  local_88.data._M_elems[0xe] = local_d8.data._M_elems[0xe];
  local_88.data._M_elems[0xf] = local_d8.data._M_elems[0xf];
  local_88.exp = local_d8.exp;
  local_88.neg = local_d8.neg;
  local_88.fpclass = local_d8.fpclass;
  local_88.prec_elem = local_d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_88,&local_328);
  entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_128,this);
  local_328.fpclass = cpp_dec_float_finite;
  local_328.prec_elem = 0x10;
  local_328.data._M_elems[0] = 0;
  local_328.data._M_elems[1] = 0;
  local_328.data._M_elems[2] = 0;
  local_328.data._M_elems[3] = 0;
  local_328.data._M_elems[4] = 0;
  local_328.data._M_elems[5] = 0;
  local_328.data._M_elems[6] = 0;
  local_328.data._M_elems[7] = 0;
  local_328.data._M_elems[8] = 0;
  local_328.data._M_elems[9] = 0;
  local_328.data._M_elems[10] = 0;
  local_328.data._M_elems[0xb] = 0;
  local_328.data._M_elems[0xc] = 0;
  local_328.data._M_elems[0xd] = 0;
  local_328.data._M_elems._56_5_ = 0;
  local_328.data._M_elems[0xf]._1_3_ = 0;
  local_328.exp = 0;
  local_328.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_328,100.0);
  local_d8.data._M_elems[0] = local_128.data._M_elems[0];
  local_d8.data._M_elems[1] = local_128.data._M_elems[1];
  local_d8.data._M_elems[2] = local_128.data._M_elems[2];
  local_d8.data._M_elems[3] = local_128.data._M_elems[3];
  local_d8.data._M_elems[4] = local_128.data._M_elems[4];
  local_d8.data._M_elems[5] = local_128.data._M_elems[5];
  local_d8.data._M_elems[6] = local_128.data._M_elems[6];
  local_d8.data._M_elems[7] = local_128.data._M_elems[7];
  local_d8.data._M_elems[8] = local_128.data._M_elems[8];
  local_d8.data._M_elems[9] = local_128.data._M_elems[9];
  local_d8.data._M_elems[10] = local_128.data._M_elems[10];
  local_d8.data._M_elems[0xb] = local_128.data._M_elems[0xb];
  local_d8.data._M_elems[0xc] = local_128.data._M_elems[0xc];
  local_d8.data._M_elems[0xd] = local_128.data._M_elems[0xd];
  local_d8.data._M_elems[0xe] = local_128.data._M_elems[0xe];
  local_d8.data._M_elems[0xf] = local_128.data._M_elems[0xf];
  local_d8.exp = local_128.exp;
  local_d8.neg = local_128.neg;
  local_d8.fpclass = local_128.fpclass;
  local_d8.prec_elem = local_128.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_d8,&local_328);
  entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_328,this);
  RVar7 = Tolerances::epsilon((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems._56_5_ = 0;
  local_2d8.data._M_elems[0xf]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_2d8,RVar7);
  local_128.data._M_elems[0xf]._1_3_ = local_328.data._M_elems[0xf]._1_3_;
  local_128.data._M_elems._56_5_ = local_328.data._M_elems._56_5_;
  local_128.data._M_elems[0] = local_328.data._M_elems[0];
  local_128.data._M_elems[1] = local_328.data._M_elems[1];
  local_128.data._M_elems[2] = local_328.data._M_elems[2];
  local_128.data._M_elems[3] = local_328.data._M_elems[3];
  local_128.data._M_elems[4] = local_328.data._M_elems[4];
  local_128.data._M_elems[5] = local_328.data._M_elems[5];
  local_128.data._M_elems[6] = local_328.data._M_elems[6];
  local_128.data._M_elems[7] = local_328.data._M_elems[7];
  local_128.data._M_elems[8] = local_328.data._M_elems[8];
  local_128.data._M_elems[9] = local_328.data._M_elems[9];
  local_128.data._M_elems[10] = local_328.data._M_elems[10];
  local_128.data._M_elems[0xb] = local_328.data._M_elems[0xb];
  local_128.data._M_elems[0xc] = local_328.data._M_elems[0xc];
  local_128.data._M_elems[0xd] = local_328.data._M_elems[0xd];
  local_128.exp = local_328.exp;
  local_128.neg = local_328.neg;
  local_128.fpclass = local_328.fpclass;
  local_128.prec_elem = local_328.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_128,&local_2d8)
  ;
  uVar20 = (ulong)(this->thecovectors->set).thenum;
  if (0 < (long)uVar20) {
    local_270 = &this->random;
    lVar21 = uVar20 * 0x50;
    do {
      pnVar4 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar18 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar21);
      local_328.fpclass = cpp_dec_float_finite;
      local_328.prec_elem = 0x10;
      local_328.data._M_elems[0] = 0;
      local_328.data._M_elems[1] = 0;
      local_328.data._M_elems[2] = 0;
      local_328.data._M_elems[3] = 0;
      local_328.data._M_elems[4] = 0;
      local_328.data._M_elems[5] = 0;
      local_328.data._M_elems[6] = 0;
      local_328.data._M_elems[7] = 0;
      local_328.data._M_elems[8] = 0;
      local_328.data._M_elems[9] = 0;
      local_328.data._M_elems[10] = 0;
      local_328.data._M_elems[0xb] = 0;
      local_328.data._M_elems[0xc] = 0;
      local_328.data._M_elems[0xd] = 0;
      local_328.data._M_elems._56_5_ = 0;
      local_328.data._M_elems[0xf]._1_3_ = 0;
      local_328.exp = 0;
      local_328.neg = false;
      if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_328) {
        local_328.data._M_elems._0_8_ = *(undefined8 *)puVar18;
        local_328.data._M_elems._8_8_ =
             *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x48);
        local_328.data._M_elems._16_8_ =
             *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x40);
        local_328.data._M_elems._24_8_ =
             *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x38);
        local_328.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x30);
        local_328.data._M_elems._40_8_ =
             *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x28);
        local_328.data._M_elems._48_8_ =
             *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x20);
        uVar9 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x18);
        local_328.data._M_elems._56_5_ = SUB85(uVar9,0);
        local_328.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_328.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar21 + -0x10);
        local_328.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar21 + -0xc);
        local_328._72_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -8);
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_328,&local_128);
      pUVar19 = this->theFvec;
      iVar8 = (int)uVar20;
      if ((local_328.fpclass == cpp_dec_float_NaN) ||
         (pnVar4 = (pUVar19->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)&pnVar4->m_backend + lVar21 + -8) == 2)) {
LAB_003cd8ad:
        pnVar4 = (pUVar19->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar5 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (uint *)((long)&pnVar5[-1].m_backend.data + lVar21);
        local_328.fpclass = cpp_dec_float_finite;
        local_328.prec_elem = 0x10;
        local_328.data._M_elems[0] = 0;
        local_328.data._M_elems[1] = 0;
        local_328.data._M_elems[2] = 0;
        local_328.data._M_elems[3] = 0;
        local_328.data._M_elems[4] = 0;
        local_328.data._M_elems[5] = 0;
        local_328.data._M_elems[6] = 0;
        local_328.data._M_elems[7] = 0;
        local_328.data._M_elems[8] = 0;
        local_328.data._M_elems[9] = 0;
        local_328.data._M_elems[10] = 0;
        local_328.data._M_elems[0xb] = 0;
        local_328.data._M_elems[0xc] = 0;
        local_328.data._M_elems[0xd] = 0;
        local_328.data._M_elems._56_5_ = 0;
        local_328.data._M_elems[0xf]._1_3_ = 0;
        local_328.exp = 0;
        local_328.neg = false;
        if ((cpp_dec_float<100U,_int,_void> *)puVar18 != &local_328) {
          local_328.data._M_elems._0_8_ = *(undefined8 *)puVar18;
          local_328.data._M_elems._8_8_ =
               *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x48);
          local_328.data._M_elems._16_8_ =
               *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x40);
          local_328.data._M_elems._24_8_ =
               *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x38);
          local_328.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x30);
          local_328.data._M_elems._40_8_ =
               *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x28);
          local_328.data._M_elems._48_8_ =
               *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x20);
          uVar9 = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x18);
          local_328.data._M_elems._56_5_ = SUB85(uVar9,0);
          local_328.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
          local_328.exp = *(int *)((long)&(pnVar5->m_backend).data + lVar21 + -0x10);
          local_328.neg = *(bool *)((long)&(pnVar5->m_backend).data + lVar21 + -0xc);
          local_328._72_8_ = *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_328,&local_128);
        if (((*(int *)((long)&pnVar4->m_backend + lVar21 + -8) != 2) &&
            (local_328.fpclass != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)(pnVar4 + 0xffffffffffffffff) + lVar21),&local_328),
           iVar16 < 0)) {
          pnVar4 = (this->theLBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar21);
          pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                   ((long)((this->theFvec->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0xffffffffffffffff) + lVar21)
          ;
          local_2d8.fpclass = cpp_dec_float_finite;
          local_2d8.prec_elem = 0x10;
          local_2d8.data._M_elems[0] = 0;
          local_2d8.data._M_elems[1] = 0;
          local_2d8.data._M_elems[2] = 0;
          local_2d8.data._M_elems[3] = 0;
          local_2d8.data._M_elems[4] = 0;
          local_2d8.data._M_elems[5] = 0;
          local_2d8.data._M_elems[6] = 0;
          local_2d8.data._M_elems[7] = 0;
          local_2d8.data._M_elems[8] = 0;
          local_2d8.data._M_elems[9] = 0;
          local_2d8.data._M_elems[10] = 0;
          local_2d8.data._M_elems[0xb] = 0;
          local_2d8.data._M_elems[0xc] = 0;
          local_2d8.data._M_elems[0xd] = 0;
          local_2d8.data._M_elems._56_5_ = 0;
          local_2d8.data._M_elems[0xf]._1_3_ = 0;
          local_2d8.exp = 0;
          local_2d8.neg = false;
          if (pcVar1 == &local_2d8) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_2d8,pcVar17);
            if (local_2d8.data._M_elems[0] != 0 || local_2d8.fpclass != cpp_dec_float_finite) {
              local_2d8.neg = (bool)(local_2d8.neg ^ 1);
            }
          }
          else {
            if (pcVar17 != &local_2d8) {
              local_2d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
              local_2d8.data._M_elems._8_8_ =
                   *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x48);
              local_2d8.data._M_elems._16_8_ =
                   *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x40);
              local_2d8.data._M_elems._24_8_ =
                   *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x38);
              local_2d8.data._M_elems._32_8_ =
                   *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x30);
              local_2d8.data._M_elems._40_8_ =
                   *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x28);
              local_2d8.data._M_elems._48_8_ =
                   *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x20);
              uVar9 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x18);
              local_2d8.data._M_elems._56_5_ = SUB85(uVar9,0);
              local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
              local_2d8.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar21 + -0x10);
              local_2d8.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar21 + -0xc);
              local_2d8._72_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_2d8,pcVar1);
          }
          local_328.data._M_elems[0xc] = local_2d8.data._M_elems[0xc];
          local_328.data._M_elems[0xd] = local_2d8.data._M_elems[0xd];
          local_328.data._M_elems._56_5_ = local_2d8.data._M_elems._56_5_;
          local_328.data._M_elems[0xf]._1_3_ = local_2d8.data._M_elems[0xf]._1_3_;
          local_328.data._M_elems[8] = local_2d8.data._M_elems[8];
          local_328.data._M_elems[9] = local_2d8.data._M_elems[9];
          local_328.data._M_elems[10] = local_2d8.data._M_elems[10];
          local_328.data._M_elems[0xb] = local_2d8.data._M_elems[0xb];
          local_328.data._M_elems[4] = local_2d8.data._M_elems[4];
          local_328.data._M_elems[5] = local_2d8.data._M_elems[5];
          local_328.data._M_elems[6] = local_2d8.data._M_elems[6];
          local_328.data._M_elems[7] = local_2d8.data._M_elems[7];
          local_328.data._M_elems[0] = local_2d8.data._M_elems[0];
          local_328.data._M_elems[1] = local_2d8.data._M_elems[1];
          local_328.data._M_elems[2] = local_2d8.data._M_elems[2];
          local_328.data._M_elems[3] = local_2d8.data._M_elems[3];
          local_328.exp = local_2d8.exp;
          local_328.neg = local_2d8.neg;
          local_328.fpclass = local_2d8.fpclass;
          local_328.prec_elem = local_2d8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_328,&local_128);
          pnVar4 = (this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((*(int *)((long)&(pnVar4->m_backend).data + lVar21 + -8) == 2) ||
              (pnVar5 = (this->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar5->m_backend).data + lVar21 + -8) == 2)) ||
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)
                                  ((long)&pnVar4[-1].m_backend.data + lVar21),
                                  (cpp_dec_float<100U,_int,_void> *)
                                  ((long)&pnVar5[-1].m_backend.data + lVar21)), iVar16 != 0)) {
            pnVar4 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_278 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        extract_double(&local_88);
            local_280 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        extract_double(&local_d8);
            RVar7 = Random::next_random(local_270);
            local_268.fpclass = cpp_dec_float_finite;
            local_268.prec_elem = 0x10;
            local_268.data._M_elems[0] = 0;
            local_268.data._M_elems[1] = 0;
            local_268.data._M_elems[2] = 0;
            local_268.data._M_elems[3] = 0;
            local_268.data._M_elems[4] = 0;
            local_268.data._M_elems[5] = 0;
            local_268.data._M_elems[6] = 0;
            local_268.data._M_elems[7] = 0;
            local_268.data._M_elems[8] = 0;
            local_268.data._M_elems[9] = 0;
            local_268.data._M_elems[10] = 0;
            local_268.data._M_elems[0xb] = 0;
            local_268.data._M_elems[0xc] = 0;
            local_268.data._M_elems[0xd] = 0;
            local_268.data._M_elems._56_5_ = 0;
            local_268.data._M_elems[0xf]._1_3_ = 0;
            local_268.exp = 0;
            local_268.neg = false;
            local_328.fpclass = cpp_dec_float_finite;
            local_328.prec_elem = 0x10;
            local_328.data._M_elems[0] = 0;
            local_328.data._M_elems[1] = 0;
            local_328.data._M_elems[2] = 0;
            local_328.data._M_elems[3] = 0;
            local_328.data._M_elems[4] = 0;
            local_328.data._M_elems[5] = 0;
            local_328.data._M_elems[6] = 0;
            local_328.data._M_elems[7] = 0;
            local_328.data._M_elems[8] = 0;
            local_328.data._M_elems[9] = 0;
            local_328.data._M_elems[10] = 0;
            local_328.data._M_elems[0xb] = 0;
            local_328.data._M_elems[0xc] = 0;
            local_328.data._M_elems[0xd] = 0;
            local_328.data._M_elems._56_5_ = 0;
            local_328.data._M_elems[0xf]._1_3_ = 0;
            local_328.exp = 0;
            local_328.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_328,
                       RVar7 * local_280 + (1.0 - RVar7) * local_278);
            if ((cpp_dec_float<100U,_int,_void> *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21) !=
                &local_268) {
              local_268.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)
                     ((long)(pnVar4 + 0xffffffffffffffff) + lVar21))->data)._M_elems;
              local_268.data._M_elems._8_8_ =
                   *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x48);
              local_268.data._M_elems._16_8_ =
                   *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x40);
              local_268.data._M_elems._24_8_ =
                   *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x38);
              local_268.data._M_elems._32_8_ =
                   *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x30);
              local_268.data._M_elems._40_8_ =
                   *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x28);
              local_268.data._M_elems._48_8_ =
                   *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x20);
              uVar9 = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x18);
              local_268.data._M_elems._56_5_ = SUB85(uVar9,0);
              local_268.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
              local_268.exp = *(int *)((long)&pnVar4->m_backend + lVar21 + -0x10);
              local_268.neg = *(bool *)((long)&pnVar4->m_backend + lVar21 + -0xc);
              local_268._72_8_ = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_268,&local_328);
            shiftLBbound(this,iVar8 + -1,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_268);
          }
          else {
            pnVar4 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1c8.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21);
            local_1c8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((uint *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21) + 2);
            puVar18 = (uint *)((long)&pnVar4->m_backend + lVar21 + -0x40);
            local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar18;
            local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar18 + 2);
            puVar18 = (uint *)((long)&pnVar4->m_backend + lVar21 + -0x30);
            local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar18;
            local_1c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar18 + 2);
            puVar18 = (uint *)((long)&pnVar4->m_backend + lVar21 + -0x20);
            local_1c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar18;
            local_1c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar18 + 2);
            local_1c8.m_backend.exp = *(int *)((long)&pnVar4->m_backend + lVar21 + -0x10);
            local_1c8.m_backend.neg = *(bool *)((long)&pnVar4->m_backend + lVar21 + -0xc);
            local_1c8.m_backend._72_8_ = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -8);
            shiftLBbound(this,iVar8 + -1,&local_1c8);
            pnVar4 = (this->theUBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar5 = (this->theLBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (undefined8 *)((long)&pnVar5[-1].m_backend.data + lVar21);
            uVar9 = *puVar2;
            uVar10 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x40);
            uVar11 = *puVar2;
            uVar12 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x30);
            uVar13 = *puVar2;
            uVar14 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x20);
            uVar15 = puVar2[1];
            puVar3 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x20);
            *puVar3 = *puVar2;
            puVar3[1] = uVar15;
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x30);
            *puVar2 = uVar13;
            puVar2[1] = uVar14;
            puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x40);
            *puVar2 = uVar11;
            puVar2[1] = uVar12;
            puVar2 = (undefined8 *)((long)&pnVar4[-1].m_backend.data + lVar21);
            *puVar2 = uVar9;
            puVar2[1] = uVar10;
            *(undefined4 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x10) =
                 *(undefined4 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x10);
            *(undefined1 *)((long)&(pnVar4->m_backend).data + lVar21 + -0xc) =
                 *(undefined1 *)((long)&(pnVar5->m_backend).data + lVar21 + -0xc);
            *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -8) =
                 *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -8);
          }
        }
      }
      else {
        iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_328,
                            (cpp_dec_float<100U,_int,_void> *)
                            ((long)(pnVar4 + 0xffffffffffffffff) + lVar21));
        pUVar19 = this->theFvec;
        if (-1 < iVar16) goto LAB_003cd8ad;
        pnVar4 = (pUVar19->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar17 = (cpp_dec_float<100U,_int,_void> *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21);
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&(this->theUBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar21);
        local_2d8.fpclass = cpp_dec_float_finite;
        local_2d8.prec_elem = 0x10;
        local_2d8.data._M_elems[0] = 0;
        local_2d8.data._M_elems[1] = 0;
        local_2d8.data._M_elems[2] = 0;
        local_2d8.data._M_elems[3] = 0;
        local_2d8.data._M_elems[4] = 0;
        local_2d8.data._M_elems[5] = 0;
        local_2d8.data._M_elems[6] = 0;
        local_2d8.data._M_elems[7] = 0;
        local_2d8.data._M_elems[8] = 0;
        local_2d8.data._M_elems[9] = 0;
        local_2d8.data._M_elems[10] = 0;
        local_2d8.data._M_elems[0xb] = 0;
        local_2d8.data._M_elems[0xc] = 0;
        local_2d8.data._M_elems[0xd] = 0;
        local_2d8.data._M_elems._56_5_ = 0;
        local_2d8.data._M_elems[0xf]._1_3_ = 0;
        local_2d8.exp = 0;
        local_2d8.neg = false;
        if (pcVar1 == &local_2d8) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_2d8,pcVar17);
          if (local_2d8.data._M_elems[0] != 0 || local_2d8.fpclass != cpp_dec_float_finite) {
            local_2d8.neg = (bool)(local_2d8.neg ^ 1);
          }
        }
        else {
          if (pcVar17 != &local_2d8) {
            local_2d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar17->data)._M_elems;
            local_2d8.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x48);
            local_2d8.data._M_elems._16_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x40);
            local_2d8.data._M_elems._24_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x38);
            local_2d8.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x30);
            local_2d8.data._M_elems._40_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x28);
            local_2d8.data._M_elems._48_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x20);
            uVar9 = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x18);
            local_2d8.data._M_elems._56_5_ = SUB85(uVar9,0);
            local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
            local_2d8.exp = *(int *)((long)&pnVar4->m_backend + lVar21 + -0x10);
            local_2d8.neg = *(bool *)((long)&pnVar4->m_backend + lVar21 + -0xc);
            local_2d8._72_8_ = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_2d8,pcVar1);
        }
        local_328.data._M_elems[0xc] = local_2d8.data._M_elems[0xc];
        local_328.data._M_elems[0xd] = local_2d8.data._M_elems[0xd];
        local_328.data._M_elems._56_5_ = local_2d8.data._M_elems._56_5_;
        local_328.data._M_elems[0xf]._1_3_ = local_2d8.data._M_elems[0xf]._1_3_;
        local_328.data._M_elems[8] = local_2d8.data._M_elems[8];
        local_328.data._M_elems[9] = local_2d8.data._M_elems[9];
        local_328.data._M_elems[10] = local_2d8.data._M_elems[10];
        local_328.data._M_elems[0xb] = local_2d8.data._M_elems[0xb];
        local_328.data._M_elems[4] = local_2d8.data._M_elems[4];
        local_328.data._M_elems[5] = local_2d8.data._M_elems[5];
        local_328.data._M_elems[6] = local_2d8.data._M_elems[6];
        local_328.data._M_elems[7] = local_2d8.data._M_elems[7];
        local_328.data._M_elems[0] = local_2d8.data._M_elems[0];
        local_328.data._M_elems[1] = local_2d8.data._M_elems[1];
        local_328.data._M_elems[2] = local_2d8.data._M_elems[2];
        local_328.data._M_elems[3] = local_2d8.data._M_elems[3];
        local_328.exp = local_2d8.exp;
        local_328.neg = local_2d8.neg;
        local_328.fpclass = local_2d8.fpclass;
        local_328.prec_elem = local_2d8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_328,&local_128);
        pnVar4 = (this->theUBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((*(int *)((long)&(pnVar4->m_backend).data + lVar21 + -8) == 2) ||
            (pnVar5 = (this->theLBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            *(int *)((long)&(pnVar5->m_backend).data + lVar21 + -8) == 2)) ||
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar4[-1].m_backend.data + lVar21),
                                (cpp_dec_float<100U,_int,_void> *)
                                ((long)&pnVar5[-1].m_backend.data + lVar21)), iVar16 != 0)) {
          pnVar4 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_278 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                      extract_double(&local_88);
          local_280 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                      extract_double(&local_d8);
          RVar7 = Random::next_random(local_270);
          local_218.fpclass = cpp_dec_float_finite;
          local_218.prec_elem = 0x10;
          local_218.data._M_elems[0] = 0;
          local_218.data._M_elems[1] = 0;
          local_218.data._M_elems[2] = 0;
          local_218.data._M_elems[3] = 0;
          local_218.data._M_elems[4] = 0;
          local_218.data._M_elems[5] = 0;
          local_218.data._M_elems[6] = 0;
          local_218.data._M_elems[7] = 0;
          local_218.data._M_elems[8] = 0;
          local_218.data._M_elems[9] = 0;
          local_218.data._M_elems[10] = 0;
          local_218.data._M_elems[0xb] = 0;
          local_218.data._M_elems[0xc] = 0;
          local_218.data._M_elems[0xd] = 0;
          local_218.data._M_elems._56_5_ = 0;
          local_218.data._M_elems[0xf]._1_3_ = 0;
          local_218.exp = 0;
          local_218.neg = false;
          local_328.fpclass = cpp_dec_float_finite;
          local_328.prec_elem = 0x10;
          local_328.data._M_elems[0] = 0;
          local_328.data._M_elems[1] = 0;
          local_328.data._M_elems[2] = 0;
          local_328.data._M_elems[3] = 0;
          local_328.data._M_elems[4] = 0;
          local_328.data._M_elems[5] = 0;
          local_328.data._M_elems[6] = 0;
          local_328.data._M_elems[7] = 0;
          local_328.data._M_elems[8] = 0;
          local_328.data._M_elems[9] = 0;
          local_328.data._M_elems[10] = 0;
          local_328.data._M_elems[0xb] = 0;
          local_328.data._M_elems[0xc] = 0;
          local_328.data._M_elems[0xd] = 0;
          local_328.data._M_elems._56_5_ = 0;
          local_328.data._M_elems[0xf]._1_3_ = 0;
          local_328.exp = 0;
          local_328.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_328,
                     RVar7 * local_280 + (1.0 - RVar7) * local_278);
          if ((cpp_dec_float<100U,_int,_void> *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21) !=
              &local_218) {
            local_218.data._M_elems._0_8_ =
                 *(undefined8 *)
                  (((cpp_dec_float<100U,_int,_void> *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21)
                   )->data)._M_elems;
            local_218.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x48);
            local_218.data._M_elems._16_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x40);
            local_218.data._M_elems._24_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x38);
            local_218.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x30);
            local_218.data._M_elems._40_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x28);
            local_218.data._M_elems._48_8_ =
                 *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x20);
            uVar9 = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -0x18);
            local_218.data._M_elems._56_5_ = SUB85(uVar9,0);
            local_218.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
            local_218.exp = *(int *)((long)&pnVar4->m_backend + lVar21 + -0x10);
            local_218.neg = *(bool *)((long)&pnVar4->m_backend + lVar21 + -0xc);
            local_218._72_8_ = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_218,&local_328);
          shiftUBbound(this,iVar8 + -1,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_218);
        }
        else {
          pnVar4 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_178.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21);
          local_178.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((uint *)((long)(pnVar4 + 0xffffffffffffffff) + lVar21) + 2);
          puVar18 = (uint *)((long)&pnVar4->m_backend + lVar21 + -0x40);
          local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar18;
          local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar18 + 2);
          puVar18 = (uint *)((long)&pnVar4->m_backend + lVar21 + -0x30);
          local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar18;
          local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar18 + 2);
          puVar18 = (uint *)((long)&pnVar4->m_backend + lVar21 + -0x20);
          local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar18;
          local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar18 + 2);
          local_178.m_backend.exp = *(int *)((long)&pnVar4->m_backend + lVar21 + -0x10);
          local_178.m_backend.neg = *(bool *)((long)&pnVar4->m_backend + lVar21 + -0xc);
          local_178.m_backend._72_8_ = *(undefined8 *)((long)&pnVar4->m_backend + lVar21 + -8);
          shiftUBbound(this,iVar8 + -1,&local_178);
          pnVar4 = (this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar5 = (this->theLBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (undefined8 *)((long)&pnVar4[-1].m_backend.data + lVar21);
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x40);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x30);
          uVar13 = *puVar2;
          uVar14 = puVar2[1];
          puVar2 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x20);
          uVar15 = puVar2[1];
          puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x20);
          *puVar3 = *puVar2;
          puVar3[1] = uVar15;
          puVar2 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x30);
          *puVar2 = uVar13;
          puVar2[1] = uVar14;
          puVar2 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x40);
          *puVar2 = uVar11;
          puVar2[1] = uVar12;
          puVar2 = (undefined8 *)((long)&pnVar5[-1].m_backend.data + lVar21);
          *puVar2 = uVar9;
          puVar2[1] = uVar10;
          *(undefined4 *)((long)&(pnVar5->m_backend).data + lVar21 + -0x10) =
               *(undefined4 *)((long)&(pnVar4->m_backend).data + lVar21 + -0x10);
          *(undefined1 *)((long)&(pnVar5->m_backend).data + lVar21 + -0xc) =
               *(undefined1 *)((long)&(pnVar4->m_backend).data + lVar21 + -0xc);
          *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar21 + -8) =
               *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar21 + -8);
        }
      }
      lVar21 = lVar21 + -0x50;
      bVar6 = 1 < uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar6);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftFvec()
{

   /* the allowed tolerance is (rep() == COLUMN) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because theFvec is the primal VectorBase<R> in COLUMN
    * and the dual VectorBase<R> in ROW representation; this is equivalent to entertol()
    */
   R minrandom = 10.0 * entertol();
   R maxrandom = 100.0 * entertol();
   R allow = entertol() - epsilon();

   assert(type() == ENTER);
   assert(allow > 0);

   for(int i = dim() - 1; i >= 0; --i)
   {
      if(theUBbound[i] + allow < (*theFvec)[i])
      {
         SPxOut::debug(this, "DSHIFT08 theUBbound[{}] violated by {}", i,
                       (*theFvec)[i] - theUBbound[i] - allow);

         if(theUBbound[i] != theLBbound[i])
         {
            // since minrandom and maxrandom are of the order 10 different,
            // we currently doesn't care about higher precision random
            // numbers. Hence the cast to double.
            shiftUBbound(i, (*theFvec)[i] + random.next((double)minrandom, (double)maxrandom));
         }
         else
         {
            shiftUBbound(i, (*theFvec)[i]);
            theLBbound[i] = theUBbound[i];
         }
      }
      else if((*theFvec)[i] < theLBbound[i] - allow)
      {
         SPxOut::debug(this, "DSHIFT08 theLBbound[{}] violated by {}", i,
                       theLBbound[i] - (*theFvec)[i] - allow);

         if(theUBbound[i] != theLBbound[i])
            shiftLBbound(i, (*theFvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLBbound(i, (*theFvec)[i]);
            theUBbound[i] = theLBbound[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT01 shiftFvec: OK\n");
#endif
}